

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  ulong uVar5;
  ulong value;
  byte *pbVar6;
  ulong uVar7;
  Value VStack_48;
  
  pbVar3 = (byte *)token->end_;
  cVar1 = *token->start_;
  uVar5 = -(ulong)(cVar1 != '-') | 0x8000000000000000;
  pbVar6 = (byte *)(token->start_ + (cVar1 == '-'));
  if (pbVar6 < pbVar3) {
    value = 0;
    do {
      bVar2 = *pbVar6;
      if ((byte)(bVar2 - 0x3a) < 0xf6) {
LAB_005faf6b:
        bVar4 = decodeDouble(this,token,decoded);
        return bVar4;
      }
      pbVar6 = pbVar6 + 1;
      uVar7 = (ulong)(bVar2 - 0x30);
      if ((uVar5 / 10 <= value) &&
         (((uVar5 / 10 < value || (pbVar6 != pbVar3)) || (uVar5 % 10 < uVar7)))) goto LAB_005faf6b;
      value = uVar7 + value * 10;
    } while (pbVar6 < pbVar3);
    if ((cVar1 == '-') && (value == uVar5)) {
      value = 0x8000000000000000;
    }
    else {
      if (cVar1 == '-') goto LAB_005faf3a;
      if (0x7fffffff < value) {
        Value::Value(&VStack_48,value);
        goto LAB_005faf4b;
      }
    }
  }
  else {
    value = 0;
    if (cVar1 == '-') {
LAB_005faf3a:
      value = -value;
    }
  }
  Value::Value(&VStack_48,value);
LAB_005faf4b:
  Value::operator=(decoded,&VStack_48);
  Value::~Value(&VStack_48);
  return true;
}

Assistant:

bool Reader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  // TODO: Help the compiler do the div and mod at compile time or get rid of
  // them.
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(Value::maxLargestInt) + 1
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);
    auto digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative && value == maxIntegerValue)
    decoded = Value::minLargestInt;
  else if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}